

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O3

int md5_done(hash_state *md,uchar *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  if (md == (hash_state *)0x0) {
    crypt_argchk("md != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/md5.c"
                 ,0x108);
  }
  if (out == (uchar *)0x0) {
    crypt_argchk("out != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/md5.c"
                 ,0x109);
  }
  uVar1 = (md->sha1).state[4];
  uVar3 = (ulong)uVar1;
  if (0x3f < uVar3) {
    return 0x10;
  }
  md->data = (void *)((long)md->data + uVar3 * 8);
  uVar2 = uVar1 + 1;
  (md->sha1).state[4] = uVar2;
  *(undefined1 *)((long)md + uVar3 + 0x1c) = 0x80;
  if (uVar1 < 0x38) {
    if (uVar1 == 0x37) goto LAB_0011d908;
  }
  else {
    if (uVar1 != 0x3f) {
      memset((void *)((long)md + uVar3 + 0x1d),0,(ulong)(0x3f - uVar1));
      (md->sha1).state[4] = 0x40;
    }
    md5_compress(md,(md->md5).buf);
    uVar2 = 0;
  }
  memset((void *)((long)md + (ulong)uVar2 + 0x1c),0,(ulong)(0x38 - uVar2));
  (md->sha1).state[4] = 0x38;
LAB_0011d908:
  *(ulong64 *)((md->sha1).buf + 0x34) = (md->sha1).length;
  md5_compress(md,(md->md5).buf);
  lVar4 = 0;
  do {
    *(undefined4 *)(out + lVar4 * 4) = *(undefined4 *)((long)md + lVar4 * 4 + 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return 0;
}

Assistant:

int md5_done(hash_state * md, unsigned char *out)
{
    int i;

    LTC_ARGCHK(md  != NULL);
    LTC_ARGCHK(out != NULL);

    if (md->md5.curlen >= sizeof(md->md5.buf)) {
       return CRYPT_INVALID_ARG;
    }


    /* increase the length of the message */
    md->md5.length += md->md5.curlen * 8;

    /* append the '1' bit */
    md->md5.buf[md->md5.curlen++] = (unsigned char)0x80;

    /* if the length is currently above 56 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->md5.curlen > 56) {
        while (md->md5.curlen < 64) {
            md->md5.buf[md->md5.curlen++] = (unsigned char)0;
        }
        md5_compress(md, md->md5.buf);
        md->md5.curlen = 0;
    }

    /* pad upto 56 bytes of zeroes */
    while (md->md5.curlen < 56) {
        md->md5.buf[md->md5.curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64L(md->md5.length, md->md5.buf+56);
    md5_compress(md, md->md5.buf);

    /* copy output */
    for (i = 0; i < 4; i++) {
        STORE32L(md->md5.state[i], out+(4*i));
    }
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
    return CRYPT_OK;
}